

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int program_options(Parg *pg)

{
  pointer *__return_storage_ptr__;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  Parg *pPVar1;
  bool bVar2;
  Parg *this;
  ostream *poVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  size_type sVar4;
  byte local_a21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_860;
  string local_7c0;
  string local_7a0;
  allocator<char> local_779;
  string local_778;
  string local_758;
  allocator<char> local_731;
  string local_730;
  reference local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  similar_names;
  string local_6b8;
  string local_698;
  byte local_671;
  string local_670;
  int local_650;
  allocator<char> local_649;
  int status;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  allocator<char> local_581;
  string local_580;
  allocator<char> local_559;
  string local_558;
  allocator<char> local_531;
  string local_530;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  allocator<char> local_469;
  string local_468;
  allocator<char> local_441;
  string local_440;
  allocator<char> local_419;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_353;
  undefined1 local_352;
  allocator<char> local_351;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  iterator local_328;
  size_type local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d3;
  undefined1 local_2d2;
  allocator<char> local_2d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  iterator local_2a8;
  size_type local_2a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  allocator<char> local_279;
  string local_278;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_254;
  undefined1 local_253;
  allocator<char> local_252;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  string local_228 [32];
  iterator local_208;
  size_type local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b4;
  undefined1 local_1b3;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  string local_188 [32];
  iterator local_168;
  size_type local_160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  Parg *local_18;
  Parg *pg_local;
  
  local_18 = pg;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"nansi",&local_39);
  this = OB::Parg::name(pg,&local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"0.1.1 (10.01.2019)",&local_71);
  OB::Parg::version(this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,
             "A CLI tool to filter ansi escape sequences and format text streams.",&local_99);
  OB::Parg::description(pPVar1,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator(&local_99);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,"[flags] [options] [--] [arguments]",&local_c1);
  OB::Parg::usage(pPVar1,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator(&local_c1);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"[-v|--version]",&local_e9)
  ;
  OB::Parg::usage(pPVar1,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator(&local_e9);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"[-h|--help]",&local_111);
  OB::Parg::usage(pPVar1,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"Examples",&local_139);
  local_1b3 = 1;
  local_1b0 = &local_1a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a8,"nansi --help",&local_1b1)
  ;
  local_1b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_188;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_188,"nansi --version",&local_1b2);
  local_1b3 = 0;
  local_168 = &local_1a8;
  local_160 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_1b4);
  __l_02._M_len = local_160;
  __l_02._M_array = local_168;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_158,__l_02,&local_1b4);
  OB::Parg::info(pPVar1,&local_138,&local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_158);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_1b4);
  local_860 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_168;
  do {
    local_860 = local_860 + -1;
    std::__cxx11::string::~string((string *)local_860);
  } while (local_860 != &local_1a8);
  std::allocator<char>::~allocator(&local_1b2);
  std::allocator<char>::~allocator(&local_1b1);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"Exit Codes",&local_1d9);
  local_253 = 1;
  local_250 = &local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"0 -> normal",&local_251);
  local_250 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"1 -> error",&local_252);
  local_253 = 0;
  local_208 = &local_248;
  local_200 = 2;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_254);
  __l_01._M_len = local_200;
  __l_01._M_array = local_208;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_1f8,__l_01,&local_254);
  OB::Parg::info(pPVar1,&local_1d8,&local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_254);
  local_8b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208;
  do {
    local_8b0 = local_8b0 + -1;
    std::__cxx11::string::~string((string *)local_8b0);
  } while (local_8b0 != &local_248);
  std::allocator<char>::~allocator(&local_252);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,"Repository",&local_279);
  local_2d2 = 1;
  local_2d0 = &local_2c8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"https://github.com/octobanana/nansi.git",&local_2d1);
  local_2d2 = 0;
  local_2a8 = &local_2c8;
  local_2a0 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_2d3);
  __l_00._M_len = local_2a0;
  __l_00._M_array = local_2a8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_298,__l_00,&local_2d3);
  OB::Parg::info(pPVar1,&local_278,&local_298);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_298);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_2d3);
  local_8f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2a8;
  do {
    local_8f0 = local_8f0 + -1;
    std::__cxx11::string::~string((string *)local_8f0);
  } while (local_8f0 != &local_2c8);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string((string *)&local_278);
  std::allocator<char>::~allocator(&local_279);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"Homepage",&local_2f9);
  local_352 = 1;
  local_350 = &local_348;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_348,"https://octobanana.com/software/nansi",&local_351);
  local_352 = 0;
  local_328 = &local_348;
  local_320 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_353);
  __l._M_len = local_320;
  __l._M_array = local_328;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_318,__l,&local_353);
  OB::Parg::info(pPVar1,&local_2f8,&local_318);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_318);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_353);
  local_930 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_328;
  do {
    local_930 = local_930 + -1;
    std::__cxx11::string::~string((string *)local_930);
  } while (local_930 != &local_348);
  std::allocator<char>::~allocator(&local_351);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_378,"Brett Robinson (octobanana) <octobanana.dev@gmail.com>",
             &local_379);
  OB::Parg::author(pPVar1,&local_378);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"help,h",&local_3a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3c8,"print the help output",&local_3c9);
  OB::Parg::set(pPVar1,&local_3a0,&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f0,"version,v",&local_3f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_418,"print the program version",&local_419);
  OB::Parg::set(pPVar1,&local_3f0,&local_418);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator(&local_419);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"ansi",&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_468,"allow ansi escape sequences",&local_469);
  OB::Parg::set(pPVar1,&local_440,&local_468);
  std::__cxx11::string::~string((string *)&local_468);
  std::allocator<char>::~allocator(&local_469);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator(&local_441);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"line-wrap",&local_491);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"wrap lines at custom width or terminal width",&local_4b9);
  OB::Parg::set(pPVar1,&local_490,&local_4b8);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"auto-wrap",&local_4e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"wrap lines and auto calculate the indent width",&local_509);
  OB::Parg::set(pPVar1,&local_4e0,&local_508);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_530,"first-wrap",&local_531);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"if the indentation level is 0, don\'t wrap the line",&local_559);
  OB::Parg::set(pPVar1,&local_530,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator(&local_559);
  std::__cxx11::string::~string((string *)&local_530);
  std::allocator<char>::~allocator(&local_531);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_580,"white-space",&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"sequences of whitespace will collapse into a single whitespace",
             &local_5a9);
  OB::Parg::set(pPVar1,&local_580,&local_5a8);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  std::__cxx11::string::~string((string *)&local_580);
  std::allocator<char>::~allocator(&local_581);
  pPVar1 = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"width",&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"0",&local_5f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"num",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&status,"maximum output width",&local_649);
  OB::Parg::set(pPVar1,&local_5d0,&local_5f8,&local_620,(string *)&status);
  std::__cxx11::string::~string((string *)&status);
  std::allocator<char>::~allocator(&local_649);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  OB::Parg::set_stdin(local_18,true);
  local_650 = OB::Parg::parse(local_18);
  local_671 = 0;
  local_a21 = 0;
  if (0 < local_650) {
    OB::Parg::get_stdin_abi_cxx11_(&local_670,local_18);
    local_671 = 1;
    local_a21 = std::__cxx11::string::empty();
  }
  if ((local_671 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_670);
  }
  pPVar1 = local_18;
  if ((local_a21 & 1) == 0) {
    if (local_650 < 0) {
      OB::Parg::help_abi_cxx11_(&local_6b8,local_18);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_6b8);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string((string *)&local_6b8);
      poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
      __return_storage_ptr__ =
           &similar_names.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
      OB::Parg::error_abi_cxx11_((string *)__return_storage_ptr__,local_18);
      poVar3 = std::operator<<(poVar3,(string *)__return_storage_ptr__);
      std::operator<<(poVar3,"\n");
      std::__cxx11::string::~string
                ((string *)
                 &similar_names.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      __x = OB::Parg::similar_abi_cxx11_(local_18);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range3,__x);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range3);
      if (sVar4 != 0) {
        std::operator<<((ostream *)&std::cerr,"did you mean:\n");
        __end3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range3);
        e = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range3);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&e), bVar2) {
          local_710 = __gnu_cxx::
                      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator*(&__end3);
          poVar3 = std::operator<<((ostream *)&std::cerr,"  --");
          poVar3 = std::operator<<(poVar3,(string *)local_710);
          std::operator<<(poVar3,"\n");
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end3);
        }
      }
      pg_local._4_4_ = -1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range3);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"help",&local_731);
      bVar2 = OB::Parg::get<bool>(pPVar1,&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::allocator<char>::~allocator(&local_731);
      pPVar1 = local_18;
      if (bVar2) {
        OB::Parg::help_abi_cxx11_(&local_758,local_18);
        std::operator<<((ostream *)&std::cerr,(string *)&local_758);
        std::__cxx11::string::~string((string *)&local_758);
        pg_local._4_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_778,"version",&local_779);
        bVar2 = OB::Parg::get<bool>(pPVar1,&local_778);
        std::__cxx11::string::~string((string *)&local_778);
        std::allocator<char>::~allocator(&local_779);
        if (bVar2) {
          OB::Parg::name_abi_cxx11_(&local_7a0,local_18);
          poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_7a0);
          poVar3 = std::operator<<(poVar3," v");
          OB::Parg::version_abi_cxx11_(&local_7c0,local_18);
          poVar3 = std::operator<<(poVar3,(string *)&local_7c0);
          std::operator<<(poVar3,"\n");
          std::__cxx11::string::~string((string *)&local_7c0);
          std::__cxx11::string::~string((string *)&local_7a0);
          pg_local._4_4_ = 1;
        }
        else {
          pg_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    OB::Parg::help_abi_cxx11_(&local_698,local_18);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_698);
    std::operator<<(poVar3,"\n");
    std::__cxx11::string::~string((string *)&local_698);
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: ");
    poVar3 = std::operator<<(poVar3,"expected arguments");
    std::operator<<(poVar3,"\n");
    pg_local._4_4_ = -1;
  }
  return pg_local._4_4_;
}

Assistant:

int program_options(Parg& pg)
{
  pg.name("nansi").version("0.1.1 (10.01.2019)");
  pg.description("A CLI tool to filter ansi escape sequences and format text streams.");
  pg.usage("[flags] [options] [--] [arguments]");
  pg.usage("[-v|--version]");
  pg.usage("[-h|--help]");
  pg.info("Examples", {
    "nansi --help",
    "nansi --version",
  });
  pg.info("Exit Codes", {"0 -> normal", "1 -> error"});
  pg.info("Repository", {
    "https://github.com/octobanana/nansi.git",
  });
  pg.info("Homepage", {
    "https://octobanana.com/software/nansi",
  });
  pg.author("Brett Robinson (octobanana) <octobanana.dev@gmail.com>");

  // general flags
  pg.set("help,h", "print the help output");
  pg.set("version,v", "print the program version");

  pg.set("ansi", "allow ansi escape sequences");
  pg.set("line-wrap", "wrap lines at custom width or terminal width");
  pg.set("auto-wrap", "wrap lines and auto calculate the indent width");
  pg.set("first-wrap", "if the indentation level is 0, don't wrap the line");
  pg.set("white-space", "sequences of whitespace will collapse into a single whitespace");

  pg.set("width", "0", "num", "maximum output width");

  pg.set_stdin();

  int status {pg.parse()};

  if (status > 0 && pg.get_stdin().empty())
  {
    std::cerr << pg.help() << "\n";
    std::cerr << "Error: " << "expected arguments" << "\n";

    return -1;
  }

  if (status < 0)
  {
    std::cerr << pg.help() << "\n";
    std::cerr << "Error: " << pg.error() << "\n";

    auto similar_names = pg.similar();
    if (similar_names.size() > 0)
    {
      std::cerr
      << "did you mean:\n";
      for (auto const& e : similar_names)
      {
        std::cerr
        << "  --" << e << "\n";
      }
    }

    return -1;
  }

  if (pg.get<bool>("help"))
  {
    std::cerr << pg.help();

    return 1;
  }

  if (pg.get<bool>("version"))
  {
    std::cerr << pg.name() << " v" << pg.version() << "\n";

    return 1;
  }

  return 0;
}